

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O1

void __thiscall
QInputMethodEvent::QInputMethodEvent
          (QInputMethodEvent *this,QString *preeditText,
          QList<QInputMethodEvent::Attribute> *attributes)

{
  Data *pDVar1;
  Data *pDVar2;
  
  QEvent::QEvent(&this->super_QEvent,InputMethod);
  *(undefined ***)this = &PTR__QInputMethodEvent_007e43b8;
  pDVar1 = (preeditText->d).d;
  (this->m_preedit).d.d = pDVar1;
  (this->m_preedit).d.ptr = (preeditText->d).ptr;
  (this->m_preedit).d.size = (preeditText->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->m_commit).d.d = (Data *)0x0;
  (this->m_commit).d.ptr = (char16_t *)0x0;
  (this->m_commit).d.size = 0;
  pDVar2 = (attributes->d).d;
  (this->m_attributes).d.d = pDVar2;
  (this->m_attributes).d.ptr = (attributes->d).ptr;
  (this->m_attributes).d.size = (attributes->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->m_replacementStart = 0;
  this->m_replacementLength = 0;
  return;
}

Assistant:

QInputMethodEvent::QInputMethodEvent(const QString &preeditText, const QList<Attribute> &attributes)
    : QEvent(QEvent::InputMethod), m_preedit(preeditText), m_attributes(attributes),
      m_replacementStart(0), m_replacementLength(0)
{
}